

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
A::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>>
          (A *this,AVisitor<hiberlite::KillChildren> *ar)

{
  AVisitor<hiberlite::KillChildren> *pAVar1;
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [32];
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  local_368;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_> local_2d0;
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_238;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  sql_nvp<int> local_108;
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_> local_60;
  AVisitor<hiberlite::KillChildren> *local_18;
  AVisitor<hiberlite::KillChildren> *ar_local;
  A *this_local;
  
  local_18 = ar;
  ar_local = (AVisitor<hiberlite::KillChildren> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"seti",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  hiberlite::sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_>::sql_nvp
            (&local_60,(string *)local_80,&this->seti,(string *)local_b8);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(ar,&local_60);
  hiberlite::sql_nvp<std::set<double,_std::less<double>,_std::allocator<double>_>_>::~sql_nvp
            (&local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"i",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"",&local_151);
  hiberlite::sql_nvp<int>::sql_nvp(&local_108,(string *)local_128,&this->i,(string *)local_150);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(pAVar1,&local_108);
  hiberlite::sql_nvp<int>::~sql_nvp(&local_108);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"s",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"",&local_1e9);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_1a0,(string *)local_1c0,&this->s,(string *)local_1e8);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(pAVar1,&local_1a0);
  hiberlite::
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_1a0);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"vi",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"",&local_281);
  hiberlite::sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  sql_nvp(&local_238,(string *)local_258,&this->vi,(string *)local_280);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(pAVar1,&local_238);
  hiberlite::sql_nvp<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
  ~sql_nvp(&local_238);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"v",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"",&local_319);
  hiberlite::sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  ::sql_nvp(&local_2d0,(string *)local_2f0,&this->v,(string *)local_318);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(pAVar1,&local_2d0);
  hiberlite::sql_nvp<std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  ::~sql_nvp(&local_2d0);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pAVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"mm",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"",&local_3b1);
  hiberlite::
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::sql_nvp(&local_368,(string *)local_388,&this->mm,(string *)local_3b0);
  hiberlite::AVisitor<hiberlite::KillChildren>::operator&(pAVar1,&local_368);
  hiberlite::
  sql_nvp<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~sql_nvp(&local_368);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
		ar & HIBERLITE_NVP(seti);
		ar & HIBERLITE_NVP(i);
		ar & HIBERLITE_NVP(s);
		ar & HIBERLITE_NVP(vi);
		ar & HIBERLITE_NVP(v);
		ar & HIBERLITE_NVP(mm);
	}